

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CompleteInsertion
               (Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int regNewData,int *aRegIdx,
               int update_flags,int appendBias,int useSeekResult)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Vdbe *p;
  byte local_80;
  uint local_7c;
  int local_50;
  u8 bAffinityDone;
  int i;
  int regRec;
  int regData;
  u8 pik_flags;
  Index *pIdx;
  Vdbe *v;
  int *aRegIdx_local;
  int regNewData_local;
  int iIdxCur_local;
  int iDataCur_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  bVar2 = false;
  p = sqlite3GetVdbe(pParse);
  local_50 = 0;
  for (_regData = pTab->pIndex; local_80 = (byte)update_flags, _regData != (Index *)0x0;
      _regData = _regData->pNext) {
    if (aRegIdx[local_50] != 0) {
      bVar2 = true;
      if (_regData->pPartIdxWhere != (Expr *)0x0) {
        iVar4 = aRegIdx[local_50];
        iVar3 = sqlite3VdbeCurrentAddr(p);
        sqlite3VdbeAddOp2(p,0x4b,iVar4,iVar3 + 2);
      }
      regRec._3_1_ = 0;
      if (useSeekResult != 0) {
        regRec._3_1_ = 0x10;
      }
      if (((_regData->field_0x63 & 3) == 2) && ((pTab->tabFlags & 0x20) != 0)) {
        regRec._3_1_ = regRec._3_1_ | 1 | local_80 & 2;
      }
      if (((byte)_regData->field_0x63 >> 3 & 1) == 0) {
        uVar1 = _regData->nColumn;
      }
      else {
        uVar1 = _regData->nKeyCol;
      }
      local_7c = (uint)uVar1;
      sqlite3VdbeAddOp4Int
                (p,0x7e,iIdxCur + local_50,aRegIdx[local_50],aRegIdx[local_50] + 1,local_7c);
      sqlite3VdbeChangeP5(p,(ushort)regRec._3_1_);
    }
    local_50 = local_50 + 1;
  }
  if ((pTab->tabFlags & 0x20) == 0) {
    iVar4 = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp3(p,99,regNewData + 1,(int)pTab->nCol,iVar4);
    if (!bVar2) {
      sqlite3TableAffinity(p,pTab,0);
      sqlite3ExprCacheAffinityChange(pParse,regNewData + 1,(int)pTab->nCol);
    }
    if (pParse->nested == '\0') {
      if (update_flags == 0) {
        local_80 = 0x20;
      }
      regRec._3_1_ = local_80 | 1;
    }
    else {
      regRec._3_1_ = 0;
    }
    if (appendBias != 0) {
      regRec._3_1_ = regRec._3_1_ | 8;
    }
    if (useSeekResult != 0) {
      regRec._3_1_ = regRec._3_1_ | 0x10;
    }
    sqlite3VdbeAddOp3(p,0x74,iDataCur,iVar4,regNewData);
    if (pParse->nested == '\0') {
      sqlite3VdbeAppendP4(p,pTab,-6);
    }
    sqlite3VdbeChangeP5(p,(ushort)regRec._3_1_);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CompleteInsertion(
  Parse *pParse,      /* The parser context */
  Table *pTab,        /* the table into which we are inserting */
  int iDataCur,       /* Cursor of the canonical data source */
  int iIdxCur,        /* First index cursor */
  int regNewData,     /* Range of content */
  int *aRegIdx,       /* Register used by each index.  0 for unused indices */
  int update_flags,   /* True for UPDATE, False for INSERT */
  int appendBias,     /* True if this is likely to be an append */
  int useSeekResult   /* True to set the USESEEKRESULT flag on OP_[Idx]Insert */
){
  Vdbe *v;            /* Prepared statements under construction */
  Index *pIdx;        /* An index being inserted or updated */
  u8 pik_flags;       /* flag values passed to the btree insert */
  int regData;        /* Content registers (after the rowid) */
  int regRec;         /* Register holding assembled record for the table */
  int i;              /* Loop counter */
  u8 bAffinityDone = 0; /* True if OP_Affinity has been run already */

  assert( update_flags==0
       || update_flags==OPFLAG_ISUPDATE
       || update_flags==(OPFLAG_ISUPDATE|OPFLAG_SAVEPOSITION)
  );

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    if( aRegIdx[i]==0 ) continue;
    bAffinityDone = 1;
    if( pIdx->pPartIdxWhere ){
      sqlite3VdbeAddOp2(v, OP_IsNull, aRegIdx[i], sqlite3VdbeCurrentAddr(v)+2);
      VdbeCoverage(v);
    }
    pik_flags = (useSeekResult ? OPFLAG_USESEEKRESULT : 0);
    if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
      assert( pParse->nested==0 );
      pik_flags |= OPFLAG_NCHANGE;
      pik_flags |= (update_flags & OPFLAG_SAVEPOSITION);
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
      if( update_flags==0 ){
        sqlite3VdbeAddOp4(v, OP_InsertInt, 
            iIdxCur+i, aRegIdx[i], 0, (char*)pTab, P4_TABLE
        );
        sqlite3VdbeChangeP5(v, OPFLAG_ISNOOP);
      }
#endif
    }
    sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iIdxCur+i, aRegIdx[i],
                         aRegIdx[i]+1,
                         pIdx->uniqNotNull ? pIdx->nKeyCol: pIdx->nColumn);
    sqlite3VdbeChangeP5(v, pik_flags);
  }
  if( !HasRowid(pTab) ) return;
  regData = regNewData + 1;
  regRec = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regData, pTab->nCol, regRec);
  sqlite3SetMakeRecordP5(v, pTab);
  if( !bAffinityDone ){
    sqlite3TableAffinity(v, pTab, 0);
    sqlite3ExprCacheAffinityChange(pParse, regData, pTab->nCol);
  }
  if( pParse->nested ){
    pik_flags = 0;
  }else{
    pik_flags = OPFLAG_NCHANGE;
    pik_flags |= (update_flags?update_flags:OPFLAG_LASTROWID);
  }
  if( appendBias ){
    pik_flags |= OPFLAG_APPEND;
  }
  if( useSeekResult ){
    pik_flags |= OPFLAG_USESEEKRESULT;
  }
  sqlite3VdbeAddOp3(v, OP_Insert, iDataCur, regRec, regNewData);
  if( !pParse->nested ){
    sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
  }
  sqlite3VdbeChangeP5(v, pik_flags);
}